

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

ostream * absl::lts_20250127::operator<<(ostream *os,Status *x)

{
  string local_30;
  
  Status::ToString_abi_cxx11_(&local_30,x,kWithEverything);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Status& x) {
  os << x.ToString(StatusToStringMode::kWithEverything);
  return os;
}